

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O0

bool TestLockPointValidity(CChain *active_chain,LockPoints *lp)

{
  long lVar1;
  bool bVar2;
  CBlockIndex *in_RSI;
  CChain *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffdc;
  bool local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,(char *)in_RSI,in_stack_ffffffffffffffdc,
             (AnnotatedMixin<std::recursive_mutex> *)0x75e53f);
  if ((in_RSI->pskip == (CBlockIndex *)0x0) || (bVar2 = CChain::Contains(in_RDI,in_RSI), bVar2)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_9;
}

Assistant:

bool TestLockPointValidity(CChain& active_chain, const LockPoints& lp)
{
    AssertLockHeld(cs_main);
    // If there are relative lock times then the maxInputBlock will be set
    // If there are no relative lock times, the LockPoints don't depend on the chain
    if (lp.maxInputBlock) {
        // Check whether active_chain is an extension of the block at which the LockPoints
        // calculation was valid.  If not LockPoints are no longer valid
        if (!active_chain.Contains(lp.maxInputBlock)) {
            return false;
        }
    }

    // LockPoints still valid
    return true;
}